

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_sendfile2(http_s *h,char *prefix,size_t prefix_len,char *encoded,size_t encoded_len)

{
  char *pcVar1;
  char cVar2;
  fio_str_info_s n;
  fio_str_info_s v;
  bool bVar3;
  long lVar4;
  int iVar5;
  FIOBJ FVar6;
  void *pvVar7;
  FIOBJ FVar8;
  size_t sVar9;
  FIOBJ FVar10;
  ulong uVar11;
  int64_t iVar12;
  size_t __n;
  ulong uVar13;
  long lVar14;
  char *__s;
  char *pcVar15;
  bool bVar16;
  uint64_t etag;
  fio_str_info_s s;
  uintptr_t local_168;
  fio_str_info_s ac_str;
  ulong local_110;
  char *pos;
  size_t sStack_100;
  char *local_f8;
  stat file_data;
  fio_str_info_s local_60;
  fio_str_info_s local_48;
  
  if (h == (http_s *)0x0) {
    return -1;
  }
  if (((h->method == 0) && (h->status_str == 0)) && (h->status != 0)) {
    return -1;
  }
  memset(&file_data,0,0x90);
  if (http_sendfile2::accept_enc_hash == 0) {
    http_sendfile2::accept_enc_hash = fiobj_hash_string("accept-encoding",0xf);
  }
  if (http_sendfile2::range_hash == 0) {
    http_sendfile2::range_hash = fiobj_hash_string("range",5);
  }
  FVar6 = fiobj_str_tmp();
  if (prefix_len != 0 && prefix != (char *)0x0) {
    if ((encoded != (char *)0x0) && (prefix[prefix_len - 1] == '/')) {
      prefix_len = prefix_len - (*encoded == '/');
    }
    fiobj_str_capa_assert(FVar6,encoded_len + prefix_len + 4);
    fiobj_str_write(FVar6,prefix,prefix_len);
  }
  fiobj_obj2cstr(&s,FVar6);
  sVar9 = s.len;
  pcVar15 = s.data;
  if (encoded != (char *)0x0) {
    pcVar15 = encoded + encoded_len;
    while (encoded < pcVar15) {
      cVar2 = *encoded;
      if (cVar2 == '%') {
        iVar5 = hex2byte((uint8_t *)(s.data + s.len),(uint8_t *)(encoded + 1));
        if (iVar5 != 0) {
          return -1;
        }
        encoded = encoded + 3;
        s.len = s.len + 1;
      }
      else {
        encoded = encoded + 1;
        s.data[s.len] = cVar2;
        s.len = s.len + 1;
      }
    }
    s.data[s.len] = '\0';
    fiobj_str_resize(FVar6,s.len);
    pcVar15 = s.data;
    sVar9 = s.len;
    __s = s.data + prefix_len;
    __n = s.len - prefix_len;
    pcVar1 = s.data + s.len;
    while ((__s < pcVar1 && (pvVar7 = memchr(__s,0x2f,__n), pvVar7 != (void *)0x0))) {
      if (*(char *)((long)pvVar7 + 1) == '/') {
        return -1;
      }
      __n = (long)pcVar1 - (long)pvVar7;
      __s = (char *)((long)pvVar7 + 1);
      if ((((3 < __n) && (*(char *)((long)pvVar7 + 1) == '.')) &&
          (*(char *)((long)pvVar7 + 2) == '.')) && (*(char *)((long)pvVar7 + 3) == '/')) {
        return -1;
      }
    }
  }
  if (pcVar15[sVar9 - 1] == '/') {
    fiobj_str_write(FVar6,"index.html",10);
  }
  fiobj_obj2cstr(&s,FVar6);
  FVar8 = fiobj_hash_get2(h->headers,http_sendfile2::accept_enc_hash);
  if ((((FVar8 == 0) || (fiobj_obj2cstr(&ac_str,FVar8), ac_str.data == (char *)0x0)) ||
      (pcVar15 = strstr(ac_str.data,"gzip"), pcVar15 == (char *)0x0)) ||
     (((s.data[s.len - 3] == '.' && (s.data[s.len - 2] == 'g')) && (s.data[s.len - 1] == 'z')))) {
LAB_0013edad:
    iVar5 = stat(s.data,(stat *)&file_data);
    if (iVar5 != 0) {
      return -1;
    }
    bVar3 = true;
    if ((file_data.st_mode & 0xd000 | 0x2000) != 0xa000) {
      return -1;
    }
  }
  else {
    fiobj_str_write(FVar6,".gz",3);
    fiobj_obj2cstr((fio_str_info_s *)&pos,FVar6);
    s.data = local_f8;
    s.capa = (size_t)pos;
    s.len = sStack_100;
    iVar5 = stat(local_f8,(stat *)&file_data);
    if ((iVar5 != 0) || ((file_data.st_mode & 0xd000 | 0x2000) != 0xa000)) {
      fiobj_str_resize(FVar6,s.len - 3);
      goto LAB_0013edad;
    }
    bVar3 = false;
  }
  FVar8 = fiobj_str_buf(0x20);
  fiobj_obj2cstr(&local_48,FVar8);
  sVar9 = http_time2str(local_48.data,file_data.st_mtim.tv_sec);
  fiobj_str_resize(FVar8,sVar9);
  http_set_header(h,HTTP_HEADER_LAST_MODIFIED,FVar8);
  FVar10 = HTTP_HVALUE_MAX_AGE;
  FVar8 = HTTP_HEADER_CACHE_CONTROL;
  fiobj_dup(HTTP_HVALUE_MAX_AGE);
  http_set_header(h,FVar8,FVar10);
  local_110 = file_data.st_mtim.tv_sec ^ file_data.st_size;
  local_110 = fiobj_hash_string(&local_110,8);
  FVar8 = fiobj_str_buf(0x20);
  fiobj_obj2cstr(&local_60,FVar8);
  iVar5 = fio_base64_encode(local_60.data,(char *)&local_110,8);
  fiobj_str_resize(FVar8,(long)iVar5);
  http_set_header(h,HTTP_HEADER_ETAG,FVar8);
  if (http_sendfile2::none_match_hash == 0) {
    http_sendfile2::none_match_hash = fiobj_hash_string("if-none-match",0xd);
  }
  FVar10 = fiobj_hash_get2(h->headers,http_sendfile2::none_match_hash);
  if ((FVar10 != 0) && (iVar5 = fiobj_iseq(FVar10,FVar8), iVar5 != 0)) {
    h->status = 0x130;
    goto LAB_0013ef2d;
  }
  if (http_sendfile2::ifrange_hash == 0) {
    http_sendfile2::ifrange_hash = fiobj_hash_string("if-range",8);
  }
  FVar10 = fiobj_hash_get2(h->headers,http_sendfile2::ifrange_hash);
  local_168 = file_data.st_size;
  if ((FVar10 == 0) || (iVar5 = fiobj_iseq(FVar10,FVar8), iVar5 == 0)) {
    FVar8 = fiobj_hash_get2(h->headers,http_sendfile2::range_hash);
    if (FVar8 == 0) goto LAB_0013f08a;
    sVar9 = fiobj_type_is(FVar8,FIOBJ_T_ARRAY);
    if (sVar9 != 0) {
      FVar8 = fiobj_ary_index(FVar8,0);
    }
    fiobj_obj2cstr(&ac_str,FVar8);
    pcVar15 = ac_str.data;
    if ((ac_str.data != (char *)0x0) && (iVar5 = bcmp("bytes=",ac_str.data,6), iVar5 == 0)) {
      pos = pcVar15 + 6;
      uVar11 = fio_atol(&pos);
      if (file_data.st_size - uVar11 == 0 || file_data.st_size < (long)uVar11) goto LAB_0013f189;
      if ((long)uVar11 < 0) {
        local_168 = -uVar11;
        bVar16 = (long)(file_data.st_size + uVar11) < 0;
        uVar13 = 0;
        if (file_data.st_size != local_168 && SBORROW8(file_data.st_size,local_168) == bVar16) {
          uVar13 = file_data.st_size - uVar11;
        }
        if (SBORROW8(file_data.st_size,local_168) != bVar16) {
          local_168 = file_data.st_size;
        }
      }
      else {
        pos = pos + 1;
        iVar12 = fio_atol(&pos);
        if (iVar12 < 1) goto LAB_0013f189;
        uVar13 = (long)(iVar12 - uVar11) >> 0x3f & uVar11;
        if (file_data.st_size < iVar12 + 1) {
          uVar13 = uVar11;
        }
        local_168 = ((iVar12 - uVar11) - uVar13) + 1;
        uVar13 = uVar11;
      }
      h->status = 0xce;
      FVar8 = fiobj_str_buf(1);
      fiobj_str_printf(FVar8,"bytes %lu-%lu/%lu",uVar11,local_168 + uVar11 + -1,file_data.st_size);
      http_set_header(h,HTTP_HEADER_CONTENT_RANGE,FVar8);
      FVar10 = HTTP_HVALUE_BYTES;
      FVar8 = HTTP_HEADER_ACCEPT_RANGES;
      fiobj_dup(HTTP_HVALUE_BYTES);
      http_set_header(h,FVar8,FVar10);
      goto LAB_0013f08d;
    }
LAB_0013f189:
    uVar13 = 0;
LAB_0013f18c:
    fiobj_obj2cstr(&ac_str,FVar6);
    s.data = ac_str.data;
    s.len = CONCAT44(ac_str.len._4_4_,(undefined4)ac_str.len);
    iVar5 = open(ac_str.data,0);
    FVar8 = HTTP_HVALUE_GZIP;
    FVar6 = HTTP_HEADER_CONTENT_ENCODING;
    if (iVar5 != -1) {
      if (bVar3) {
        lVar4 = 0;
        do {
          lVar14 = lVar4;
          if (1 - s.len == lVar14) break;
          lVar4 = lVar14 + -1;
        } while (s.data[lVar14 + (s.len - 1)] != '.');
        pcVar15 = s.data + lVar14 + s.len;
      }
      else {
        fiobj_dup(HTTP_HVALUE_GZIP);
        http_set_header(h,FVar6,FVar8);
        for (lVar14 = 0; (4 - s.len != lVar14 && (s.data[lVar14 + (s.len - 4)] != '.'));
            lVar14 = lVar14 + -1) {
        }
        pcVar15 = s.data + lVar14 + s.len + -3;
      }
      FVar6 = http_mimetype_find(pcVar15,-lVar14);
      if (FVar6 != 0) {
        http_set_header(h,HTTP_HEADER_CONTENT_TYPE,FVar6);
      }
      http_sendfile(h,iVar5,local_168,uVar13);
      return 0;
    }
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (HTTP) couldn\'t open file %s!\n",s.data);
    }
    perror("     ");
    sVar9 = 500;
  }
  else {
    fiobj_hash_delete2(h->headers,http_sendfile2::range_hash);
LAB_0013f08a:
    uVar13 = 0;
LAB_0013f08d:
    fiobj_obj2cstr(&ac_str,h->method);
    s.data = ac_str.data;
    s.capa = CONCAT44(ac_str.capa._4_4_,(undefined4)ac_str.capa);
    s.len = CONCAT44(ac_str.len._4_4_,(undefined4)ac_str.len);
    if (s.len == 3) {
      iVar5 = strncasecmp("get",ac_str.data,3);
      if (iVar5 == 0) goto LAB_0013f18c;
    }
    else if (s.len == 4) {
      iVar5 = strncasecmp("head",ac_str.data,4);
      FVar6 = HTTP_HEADER_CONTENT_LENGTH;
      if (iVar5 == 0) {
        FVar8 = fiobj_num_new(local_168);
        http_set_header(h,FVar6,FVar8);
        goto LAB_0013ef2d;
      }
    }
    else if ((s.len == 7) && (iVar5 = strncasecmp("options",ac_str.data,7), iVar5 == 0)) {
      n.data = "allow";
      n.capa = SUB168(ZEXT816(5) << 0x40,0);
      n.len = SUB168(ZEXT816(5) << 0x40,8);
      v.data = "GET, HEAD";
      v.capa = SUB168(ZEXT816(9) << 0x40,0);
      v.len = SUB168(ZEXT816(9) << 0x40,8);
      http_set_header2(h,n,v);
      h->status = 200;
LAB_0013ef2d:
      http_finish(h);
      return 0;
    }
    sVar9 = 0x193;
  }
  http_send_error(h,sVar9);
  return 0;
}

Assistant:

int http_sendfile2(http_s *h, const char *prefix, size_t prefix_len,
                   const char *encoded, size_t encoded_len) {
  if (HTTP_INVALID_HANDLE(h))
    return -1;
  struct stat file_data = {.st_size = 0};
  static uint64_t accept_enc_hash = 0;
  if (!accept_enc_hash)
    accept_enc_hash = fiobj_hash_string("accept-encoding", 15);
  static uint64_t range_hash = 0;
  if (!range_hash)
    range_hash = fiobj_hash_string("range", 5);

  /* create filename string */
  FIOBJ filename = fiobj_str_tmp();
  if (prefix && prefix_len) {
    /* start with prefix path */
    if (encoded && prefix[prefix_len - 1] == '/' && encoded[0] == '/')
      --prefix_len;
    fiobj_str_capa_assert(filename, prefix_len + encoded_len + 4);
    fiobj_str_write(filename, prefix, prefix_len);
  }
  {
    /* decode filename in cases where it's URL encoded */
    fio_str_info_s tmp = fiobj_obj2cstr(filename);
    if (encoded) {
      char *pos = (char *)encoded;
      const char *end = encoded + encoded_len;
      while (pos < end) {
        if (*pos == '%') {
          // decode hex value (this is a percent encoded value).
          if (hex2byte((uint8_t *)tmp.data + tmp.len, (uint8_t *)pos + 1))
            return -1;
          tmp.len++;
          pos += 3;
        } else
          tmp.data[tmp.len++] = *(pos++);
      }
      tmp.data[tmp.len] = 0;
      fiobj_str_resize(filename, tmp.len);
      /* test for path manipulations after decoding */
      if (http_test_encoded_path(tmp.data + prefix_len, tmp.len - prefix_len))
        return -1;
    }
    if (tmp.data[tmp.len - 1] == '/')
      fiobj_str_write(filename, "index.html", 10);
  }
  /* test for file existance  */

  int file = -1;
  uint8_t is_gz = 0;

  fio_str_info_s s = fiobj_obj2cstr(filename);
  {
    FIOBJ tmp = fiobj_hash_get2(h->headers, accept_enc_hash);
    if (!tmp)
      goto no_gzip_support;
    fio_str_info_s ac_str = fiobj_obj2cstr(tmp);
    if (!ac_str.data || !strstr(ac_str.data, "gzip"))
      goto no_gzip_support;
    if (s.data[s.len - 3] != '.' || s.data[s.len - 2] != 'g' ||
        s.data[s.len - 1] != 'z') {
      fiobj_str_write(filename, ".gz", 3);
      s = fiobj_obj2cstr(filename);
      if (!stat(s.data, &file_data) &&
          (S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode))) {
        is_gz = 1;
        goto found_file;
      }
      fiobj_str_resize(filename, s.len - 3);
    }
  }
no_gzip_support:
  if (stat(s.data, &file_data) ||
      !(S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode)))
    return -1;
found_file:
  /* set last-modified */
  {
    FIOBJ tmp = fiobj_str_buf(32);
    fiobj_str_resize(
        tmp, http_time2str(fiobj_obj2cstr(tmp).data, file_data.st_mtime));
    http_set_header(h, HTTP_HEADER_LAST_MODIFIED, tmp);
  }
  /* set cache-control */
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL, fiobj_dup(HTTP_HVALUE_MAX_AGE));
  /* set & test etag */
  uint64_t etag = (uint64_t)file_data.st_size;
  etag ^= (uint64_t)file_data.st_mtime;
  etag = fiobj_hash_string(&etag, sizeof(uint64_t));
  FIOBJ etag_str = fiobj_str_buf(32);
  fiobj_str_resize(etag_str,
                   fio_base64_encode(fiobj_obj2cstr(etag_str).data,
                                     (void *)&etag, sizeof(uint64_t)));
  /* set */
  http_set_header(h, HTTP_HEADER_ETAG, etag_str);
  /* test */
  {
    static uint64_t none_match_hash = 0;
    if (!none_match_hash)
      none_match_hash = fiobj_hash_string("if-none-match", 13);
    FIOBJ tmp2 = fiobj_hash_get2(h->headers, none_match_hash);
    if (tmp2 && fiobj_iseq(tmp2, etag_str)) {
      h->status = 304;
      http_finish(h);
      return 0;
    }
  }
  /* handle range requests */
  int64_t offset = 0;
  int64_t length = file_data.st_size;
  {
    static uint64_t ifrange_hash = 0;
    if (!ifrange_hash)
      ifrange_hash = fiobj_hash_string("if-range", 8);
    FIOBJ tmp = fiobj_hash_get2(h->headers, ifrange_hash);
    if (tmp && fiobj_iseq(tmp, etag_str)) {
      fiobj_hash_delete2(h->headers, range_hash);
    } else {
      tmp = fiobj_hash_get2(h->headers, range_hash);
      if (tmp) {
        /* range ahead... */
        if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY))
          tmp = fiobj_ary_index(tmp, 0);
        fio_str_info_s range = fiobj_obj2cstr(tmp);
        if (!range.data || memcmp("bytes=", range.data, 6))
          goto open_file;
        char *pos = range.data + 6;
        int64_t start_at = 0, end_at = 0;
        start_at = fio_atol(&pos);
        if (start_at >= file_data.st_size)
          goto open_file;
        if (start_at >= 0) {
          pos++;
          end_at = fio_atol(&pos);
          if (end_at <= 0)
            goto open_file;
        }
        /* we ignore multimple ranges, only responding with the first range. */
        if (start_at < 0) {
          if (0 - start_at < file_data.st_size) {
            offset = file_data.st_size - start_at;
            length = 0 - start_at;
          }
        } else if (end_at) {
          offset = start_at;
          length = end_at - start_at + 1;
          if (length + start_at > file_data.st_size || length <= 0)
            length = length - start_at;
        } else {
          offset = start_at;
          length = length - start_at;
        }
        h->status = 206;

        {
          FIOBJ cranges = fiobj_str_buf(1);
          fiobj_str_printf(cranges, "bytes %lu-%lu/%lu",
                           (unsigned long)start_at,
                           (unsigned long)(start_at + length - 1),
                           (unsigned long)file_data.st_size);
          http_set_header(h, HTTP_HEADER_CONTENT_RANGE, cranges);
        }
        http_set_header(h, HTTP_HEADER_ACCEPT_RANGES,
                        fiobj_dup(HTTP_HVALUE_BYTES));
      }
    }
  }
  /* test for an OPTIONS request or invalid methods */
  s = fiobj_obj2cstr(h->method);
  switch (s.len) {
  case 7:
    if (!strncasecmp("options", s.data, 7)) {
      http_set_header2(h, (fio_str_info_s){.data = (char *)"allow", .len = 5},
                       (fio_str_info_s){.data = (char *)"GET, HEAD", .len = 9});
      h->status = 200;
      http_finish(h);
      return 0;
    }
    break;
  case 3:
    if (!strncasecmp("get", s.data, 3))
      goto open_file;
    break;
  case 4:
    if (!strncasecmp("head", s.data, 4)) {
      http_set_header(h, HTTP_HEADER_CONTENT_LENGTH, fiobj_num_new(length));
      http_finish(h);
      return 0;
    }
    break;
  }
  http_send_error(h, 403);
  return 0;
open_file:
  s = fiobj_obj2cstr(filename);
  file = open(s.data, O_RDONLY);
  if (file == -1) {
    FIO_LOG_ERROR("(HTTP) couldn't open file %s!\n", s.data);
    perror("     ");
    http_send_error(h, 500);
    return 0;
  }
  {
    FIOBJ tmp = 0;
    uintptr_t pos = 0;
    if (is_gz) {
      http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                      fiobj_dup(HTTP_HVALUE_GZIP));

      pos = s.len - 4;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos - 3);

    } else {
      pos = s.len - 1;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos);
    }
    if (tmp)
      http_set_header(h, HTTP_HEADER_CONTENT_TYPE, tmp);
  }
  http_sendfile(h, file, length, offset);
  return 0;
}